

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertEquals
          (UtestShell *this,bool failed,char *expected,char *actual,char *text,char *file,int line,
          TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  byte in_SIL;
  long *in_RDI;
  SimpleString *in_R9;
  undefined8 in_stack_00000010;
  UtestShell *in_stack_ffffffffffffff48;
  undefined1 local_70 [8];
  SimpleString *in_stack_ffffffffffffff98;
  SimpleString *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  UtestShell *in_stack_ffffffffffffffb8;
  CheckEqualFailure *in_stack_ffffffffffffffc0;
  SimpleString *text_00;
  
  pTVar1 = getTestResult(in_stack_ffffffffffffff48);
  (*pTVar1->_vptr_TestResult[10])();
  if ((in_SIL & 1) != 0) {
    text_00 = in_R9;
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff48);
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff48);
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff48);
    CheckEqualFailure::CheckEqualFailure
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,text_00
              );
    (**(code **)(*in_RDI + 0x128))(in_RDI,local_70,in_stack_00000010);
    CheckEqualFailure::~CheckEqualFailure((CheckEqualFailure *)0x21a38e);
    SimpleString::~SimpleString((SimpleString *)0x21a398);
    SimpleString::~SimpleString((SimpleString *)0x21a3a2);
    SimpleString::~SimpleString((SimpleString *)0x21a3ac);
  }
  return;
}

Assistant:

void UtestShell::assertEquals(bool failed, const char* expected, const char* actual, const char* text, const char* file, int line, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (failed)
        failWith(CheckEqualFailure(this, file, line, expected, actual, text), testTerminator);
}